

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O1

int Precond(sunrealtype t,N_Vector c,N_Vector fc,int jok,int *jcurPtr,sunrealtype gamma,
           void *user_data)

{
  long lVar1;
  undefined4 *puVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  double dVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  sunrealtype *rate;
  long lVar16;
  ulong uVar17;
  undefined4 in_register_00000014;
  ulong uVar18;
  double dVar19;
  double dVar20;
  ulong local_f8;
  long local_f0;
  double local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  
  uVar9 = *(undefined8 *)((long)user_data + 0x9928);
  uVar12 = CVodeGetErrWeights(SUB84(t,0),*(undefined8 *)((long)user_data + 0x9948),uVar9,
                              CONCAT44(in_register_00000014,jok));
  if ((int)uVar12 < 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","CVodeGetErrWeights",
            (ulong)uVar12);
LAB_00103644:
    iVar13 = 1;
  }
  else {
    lVar14 = N_VGetArrayPointer(c);
    lVar15 = N_VGetArrayPointer(uVar9);
    uVar12 = *(uint *)((long)user_data + 0x48);
    uVar4 = *(uint *)((long)user_data + 0x58);
    dVar3 = *(double *)((long)user_data + 800);
    uVar5 = *(uint *)((long)user_data + 0x5c);
    iVar13 = *(int *)((long)user_data + 0x60);
    iVar6 = *(int *)((long)user_data + 100);
    rate = (sunrealtype *)N_VGetArrayPointer(*(undefined8 *)((long)user_data + 0x9930));
    dVar19 = (double)N_VWrmsNorm(fc,uVar9);
    if (0 < (long)iVar13) {
      dVar19 = ABS(gamma) * 1000.0 * 2.220446049250313e-16 * 2401.0 * dVar19;
      uVar18 = -(ulong)(dVar19 == 0.0);
      local_58 = (double)(uVar18 & 0x3ff0000000000000 | ~uVar18 & (ulong)dVar19);
      local_f0 = 0;
      do {
        if (0 < (int)uVar5) {
          iVar7 = *(int *)((long)user_data + local_f0 * 4 + 0x128);
          local_f8 = 0;
          do {
            if (0 < (int)uVar12) {
              iVar8 = *(int *)((long)user_data + local_f8 * 4 + 0x120);
              lVar16 = (long)(int)(uVar12 * iVar8 + iVar7 * iVar6);
              uVar18 = 0;
              do {
                lVar1 = uVar18 + lVar16;
                dVar19 = *(double *)(lVar14 + lVar1 * 8);
                dVar11 = ABS(dVar19) * dVar3;
                dVar20 = local_58 / *(double *)(lVar15 + lVar1 * 8);
                if (dVar11 <= dVar20) {
                  dVar11 = dVar20;
                }
                *(double *)(lVar14 + lVar1 * 8) = dVar19 + dVar11;
                WebRates(*(double *)((long)user_data + 0x310) * (double)iVar8,
                         *(double *)((long)user_data + 0x318) * (double)iVar7,dVar19,
                         (sunrealtype *)
                         (lVar14 + (long)(*(int *)((long)user_data + 0x50) * iVar7 + iVar8) *
                                   (long)*(int *)((long)user_data + 0x40) * 8),rate,
                         (WebData)user_data);
                lVar10 = *(long *)(*(long *)((long)user_data +
                                            local_f8 * 8 + local_f0 * (ulong)uVar5 * 8) + uVar18 * 8
                                  );
                uVar17 = 0;
                do {
                  *(double *)(lVar10 + uVar17 * 8) =
                       (rate[uVar17] -
                       *(double *)((long)user_data + uVar17 * 8 + lVar16 * 8 + 0x328)) *
                       (-gamma / dVar11);
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
                local_48 = SUB84(dVar19,0);
                uStack_44 = (undefined4)((ulong)dVar19 >> 0x20);
                puVar2 = (undefined4 *)(lVar14 + lVar1 * 8);
                *puVar2 = local_48;
                puVar2[1] = uStack_44;
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar12);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != uVar5);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != iVar13);
    }
    if (0 < (int)uVar4) {
      lVar14 = (long)(int)uVar12;
      uVar18 = 0;
      do {
        SUNDlsMat_denseAddIdentity(*(undefined8 *)((long)user_data + uVar18 * 8),lVar14);
        lVar15 = SUNDlsMat_denseGETRF
                           (*(undefined8 *)((long)user_data + uVar18 * 8),lVar14,lVar14,
                            *(undefined8 *)((long)user_data + uVar18 * 8 + 0x20));
        if (lVar15 != 0) goto LAB_00103644;
        uVar18 = uVar18 + 1;
      } while (uVar4 != uVar18);
    }
    *jcurPtr = 1;
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int Precond(sunrealtype t, N_Vector c, N_Vector fc, sunbooleantype jok,
                   sunbooleantype* jcurPtr, sunrealtype gamma, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int i, if0, if00, ig, igx, igy, j, jj, jx, jy;
  int *jxr, *jyr, ngrp, ngx, ngy, mxmp, mp, retval;
  sunindextype denseretval;
  sunrealtype uround, fac, r, r0, save, srur;
  sunrealtype *f1, *fsave, *cdata, *rewtdata;
  WebData wdata;
  N_Vector rewt;

  wdata  = (WebData)user_data;
  rewt   = wdata->rewt;
  retval = CVodeGetErrWeights(wdata->cvode_mem, rewt);
  if (check_retval(&retval, "CVodeGetErrWeights", 1)) { return (1); }

  cdata    = N_VGetArrayPointer(c);
  rewtdata = N_VGetArrayPointer(rewt);

  uround = SUN_UNIT_ROUNDOFF;

  P     = wdata->P;
  pivot = wdata->pivot;
  jxr   = wdata->jxr;
  jyr   = wdata->jyr;
  mp    = wdata->mp;
  srur  = wdata->srur;
  ngrp  = wdata->ngrp;
  ngx   = wdata->ngx;
  ngy   = wdata->ngy;
  mxmp  = wdata->mxmp;
  fsave = wdata->fsave;

  /* Make mp calls to fblock to approximate each diagonal block of Jacobian.
     Here, fsave contains the base value of the rate vector and
     r0 is a minimum increment factor for the difference quotient. */

  f1 = N_VGetArrayPointer(wdata->vtemp);

  fac = N_VWrmsNorm(fc, rewt);
  r0  = SUN_RCONST(1000.0) * SUNRabs(gamma) * uround * (NEQ + 1) * fac;
  if (r0 == ZERO) { r0 = ONE; }

  for (igy = 0; igy < ngy; igy++)
  {
    jy   = jyr[igy];
    if00 = jy * mxmp;
    for (igx = 0; igx < ngx; igx++)
    {
      jx  = jxr[igx];
      if0 = if00 + jx * mp;
      ig  = igx + igy * ngx;
      /* Generate ig-th diagonal block */
      for (j = 0; j < mp; j++)
      {
        /* Generate the jth column as a difference quotient */
        jj   = if0 + j;
        save = cdata[jj];
        r    = MAX(srur * SUNRabs(save), r0 / rewtdata[jj]);
        cdata[jj] += r;
        fac = -gamma / r;
        fblock(t, cdata, jx, jy, f1, wdata);
        for (i = 0; i < mp; i++)
        {
          P[ig][j][i] = (f1[i] - fsave[if0 + i]) * fac;
        }
        cdata[jj] = save;
      }
    }
  }

  /* Add identity matrix and do LU decompositions on blocks. */

  for (ig = 0; ig < ngrp; ig++)
  {
    SUNDlsMat_denseAddIdentity(P[ig], mp);
    denseretval = SUNDlsMat_denseGETRF(P[ig], mp, mp, pivot[ig]);
    if (denseretval != 0) { return (1); }
  }

  *jcurPtr = SUNTRUE;
  return (0);
}